

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O2

void __thiscall QUndoStack::redo(QUndoStack *this)

{
  int iVar1;
  QUndoStackPrivate *this_00;
  byte bVar2;
  QUndoCommand *pQVar3;
  long i;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QUndoStackPrivate **)&this->field_0x8;
  iVar1 = this_00->index;
  i = (long)iVar1;
  if ((this_00->command_list).d.size != i) {
    if ((this_00->macro_stack).d.size == 0) {
      pQVar3 = (this_00->command_list).d.ptr[i];
      bVar2 = pQVar3->d->obsolete;
      if ((bool)bVar2 == false) {
        (*pQVar3->_vptr_QUndoCommand[3])(pQVar3);
        bVar2 = pQVar3->d->obsolete;
      }
      if ((bVar2 & 1) == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QUndoStackPrivate::setIndex(this_00,this_00->index + 1,false);
          return;
        }
        goto LAB_00561f19;
      }
      pQVar3 = QList<QUndoCommand_*>::takeAt(&this_00->command_list,i);
      if (pQVar3 != (QUndoCommand *)0x0) {
        (*pQVar3->_vptr_QUndoCommand[1])(pQVar3);
      }
      if (iVar1 < this_00->clean_index) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          resetClean(this);
          return;
        }
        goto LAB_00561f19;
      }
    }
    else {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_30 = "default";
      QMessageLogger::warning(local_48,"QUndoStack::redo(): cannot redo in the middle of a macro");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00561f19:
  __stack_chk_fail();
}

Assistant:

void QUndoStack::redo()
{
    Q_D(QUndoStack);
    if (d->index == d->command_list.size())
        return;

    if (Q_UNLIKELY(!d->macro_stack.isEmpty())) {
        qWarning("QUndoStack::redo(): cannot redo in the middle of a macro");
        return;
    }

    int idx = d->index;
    QUndoCommand *cmd = d->command_list.at(idx);

    if (!cmd->isObsolete())
        cmd->redo(); // A separate check is done b/c the undo command may set obsolete flag

    if (cmd->isObsolete()) {
        delete d->command_list.takeAt(idx);

        if (d->clean_index > idx)
            resetClean();
    } else {
        d->setIndex(d->index + 1, false);
    }
}